

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip32.cpp
# Opt level: O3

bool ParseHDKeypath(string *keypath_str,vector<unsigned_int,_std::allocator<unsigned_int>_> *keypath
                   )

{
  uint uVar1;
  iterator __position;
  bool bVar2;
  int iVar3;
  istream *piVar4;
  void *pvVar5;
  size_type __n_00;
  bool bVar6;
  size_type __n;
  size_type sVar7;
  char *__data;
  _Alloc_hider _Var8;
  size_t sVar9;
  long in_FS_OFFSET;
  string_view str;
  uint32_t path;
  uint32_t number;
  string item;
  stringstream ss;
  uint local_204;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  stringstream local_1c0 [128];
  ios_base local_140 [264];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::stringstream::stringstream(local_1c0,(string *)keypath_str,_S_out|_S_in);
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  local_1e0._M_string_length = 0;
  local_1e0.field_2._M_local_buf[0] = '\0';
  bVar2 = true;
  do {
    while( true ) {
      bVar6 = bVar2;
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_1c0,(string *)&local_1e0,'/');
      uVar1 = *(uint *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18) + 0x20);
      if ((uVar1 & 5) != 0) goto LAB_001bd4ec;
      iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&local_1e0,"m");
      sVar7 = local_1e0._M_string_length;
      _Var8._M_p = local_1e0._M_dataplus._M_p;
      if (iVar3 == 0) break;
      local_204 = 0;
      if (local_1e0._M_string_length == 0) {
LAB_001bd491:
        sVar7 = 0;
        _Var8._M_p = local_1e0._M_dataplus._M_p;
      }
      else {
        pvVar5 = memchr(local_1e0._M_dataplus._M_p,0x27,local_1e0._M_string_length);
        __n_00 = (long)pvVar5 - (long)_Var8._M_p;
        if (__n_00 != 0xffffffffffffffff && pvVar5 != (void *)0x0) {
          if (__n_00 != sVar7 - 1) goto LAB_001bd4ec;
          local_204 = 0x80000000;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    (&local_200,&local_1e0,0,__n_00);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (&local_1e0,&local_200);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_200._M_dataplus._M_p._4_4_,(uint)local_200._M_dataplus._M_p) !=
              &local_200.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(local_200._M_dataplus._M_p._4_4_,
                                     (uint)local_200._M_dataplus._M_p),
                            local_200.field_2._M_allocated_capacity + 1);
          }
          sVar7 = local_1e0._M_string_length;
          _Var8._M_p = local_1e0._M_dataplus._M_p;
          if (local_1e0._M_string_length == 0) goto LAB_001bd491;
        }
        sVar9 = 0;
        do {
          pvVar5 = memchr("0123456789",(int)_Var8._M_p[sVar9],10);
          if (pvVar5 == (void *)0x0) {
            if (sVar9 != 0xffffffffffffffff) goto LAB_001bd4ec;
            break;
          }
          sVar9 = sVar9 + 1;
        } while (sVar7 != sVar9);
      }
      str._M_str = _Var8._M_p;
      str._M_len = sVar7;
      bVar2 = ParseUInt32(str,(uint32_t *)&local_200);
      if (!bVar2) goto LAB_001bd4ec;
      local_204 = local_204 | (uint)local_200._M_dataplus._M_p;
      __position._M_current =
           (keypath->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (keypath->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)keypath,__position,
                   &local_204);
      }
      else {
        *__position._M_current = local_204;
        (keypath->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      bVar2 = false;
    }
    bVar2 = false;
  } while (bVar6);
LAB_001bd4ec:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,
                    CONCAT71(local_1e0.field_2._M_allocated_capacity._1_7_,
                             local_1e0.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1c0);
  std::ios_base::~ios_base(local_140);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (uVar1 & 5) != 0;
}

Assistant:

bool ParseHDKeypath(const std::string& keypath_str, std::vector<uint32_t>& keypath)
{
    std::stringstream ss(keypath_str);
    std::string item;
    bool first = true;
    while (std::getline(ss, item, '/')) {
        if (item.compare("m") == 0) {
            if (first) {
                first = false;
                continue;
            }
            return false;
        }
        // Finds whether it is hardened
        uint32_t path = 0;
        size_t pos = item.find('\'');
        if (pos != std::string::npos) {
            // The hardened tick can only be in the last index of the string
            if (pos != item.size() - 1) {
                return false;
            }
            path |= 0x80000000;
            item = item.substr(0, item.size() - 1); // Drop the last character which is the hardened tick
        }

        // Ensure this is only numbers
        if (item.find_first_not_of( "0123456789" ) != std::string::npos) {
            return false;
        }
        uint32_t number;
        if (!ParseUInt32(item, &number)) {
            return false;
        }
        path |= number;

        keypath.push_back(path);
        first = false;
    }
    return true;
}